

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O0

Error __thiscall asmjit::CodeBuilder::getCBLabel(CodeBuilder *this,CBLabel **pOut,uint32_t id)

{
  Error EVar1;
  ulong uVar2;
  int in_EDX;
  undefined8 *in_RSI;
  ZoneVectorBase *in_RDI;
  CBLabel *node;
  Error _err;
  size_t index;
  size_t allocatedSize;
  char *in_stack_000002c0;
  int in_stack_000002cc;
  char *in_stack_000002d0;
  size_t in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  ZoneHeap *in_stack_fffffffffffffef0;
  ZoneVectorBase *pZVar3;
  undefined8 *local_100;
  Error local_d0;
  size_t *in_stack_ffffffffffffff58;
  ZoneVectorBase *in_stack_ffffffffffffff60;
  ZoneHeap *in_stack_ffffffffffffff68;
  
  if (*(int *)((long)&in_RDI[1]._capacity + 4) == 0) {
    if (in_RDI[1]._data == (void *)0x0) {
      DebugUtils::assertionFailed(in_stack_000002d0,in_stack_000002cc,in_stack_000002c0);
    }
    uVar2 = (ulong)(in_EDX - 0x100);
    if (uVar2 < *(ulong *)((long)in_RDI[1]._data + 0x100)) {
      if (in_RDI[0xe]._length <= uVar2) {
        in_stack_ffffffffffffff68 = (ZoneHeap *)(in_RDI + 0xe);
        in_stack_ffffffffffffff60 = in_RDI + 9;
        in_stack_ffffffffffffff58 = (size_t *)(uVar2 + 1);
        EVar1 = ZoneVectorBase::_resize
                          (in_RDI,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                           in_stack_fffffffffffffee0);
        if (EVar1 != 0) {
          return EVar1;
        }
      }
      if (in_RDI[0xe]._length <= uVar2) {
        DebugUtils::assertionFailed(in_stack_000002d0,in_stack_000002cc,in_stack_000002c0);
      }
      local_100 = *(undefined8 **)((long)in_RDI[0xe]._data + uVar2 * 8);
      if (local_100 == (undefined8 *)0x0) {
        if (in_RDI[9]._data == (void *)0x0) {
          DebugUtils::assertionFailed(in_stack_000002d0,in_stack_000002cc,in_stack_000002c0);
        }
        pZVar3 = in_RDI;
        local_100 = (undefined8 *)
                    ZoneHeap::_alloc(in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60,
                                     in_stack_ffffffffffffff58);
        *local_100 = 0;
        local_100[1] = 0;
        *(undefined1 *)(local_100 + 2) = 4;
        *(undefined1 *)((long)local_100 + 0x11) = 0;
        *(short *)((long)local_100 + 0x12) = (short)*(undefined4 *)((long)&in_RDI[0x10]._data + 4);
        *(undefined4 *)((long)local_100 + 0x14) = *(undefined4 *)&in_RDI[0x10]._data;
        local_100[3] = 0;
        local_100[4] = 0;
        *(int *)(local_100 + 5) = in_EDX;
        *(undefined4 *)((long)local_100 + 0x2c) = 0;
        local_100[6] = 0;
        if (local_100 == (undefined8 *)0x0) {
          return 1;
        }
        if (pZVar3[0xe]._length <= uVar2) {
          DebugUtils::assertionFailed(in_stack_000002d0,in_stack_000002cc,in_stack_000002c0);
        }
        *(undefined8 **)((long)pZVar3[0xe]._data + uVar2 * 8) = local_100;
      }
      *in_RSI = local_100;
      local_d0 = 0;
    }
    else {
      local_d0 = 0xc;
    }
  }
  else {
    local_d0 = *(Error *)((long)&in_RDI[1]._capacity + 4);
  }
  return local_d0;
}

Assistant:

Error CodeBuilder::getCBLabel(CBLabel** pOut, uint32_t id) noexcept {
  if (_lastError) return _lastError;
  ASMJIT_ASSERT(_code != nullptr);

  size_t index = Operand::unpackId(id);
  if (ASMJIT_UNLIKELY(index >= _code->getLabelsCount()))
    return DebugUtils::errored(kErrorInvalidLabel);

  if (index >= _cbLabels.getLength())
    ASMJIT_PROPAGATE(_cbLabels.resize(&_cbHeap, index + 1));

  CBLabel* node = _cbLabels[index];
  if (!node) {
    node = newNodeT<CBLabel>(id);
    if (ASMJIT_UNLIKELY(!node))
      return DebugUtils::errored(kErrorNoHeapMemory);
    _cbLabels[index] = node;
  }

  *pOut = node;
  return kErrorOk;
}